

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O3

size_t read_from_input(AvxInputContext *input_ctx,size_t n,uchar *buf)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  char *__src;
  ulong __n;
  
  sVar2 = (input_ctx->detect).position;
  __n = (input_ctx->detect).buf_read - sVar2;
  if (__n == 0) {
    sVar3 = fread(buf,1,n,(FILE *)input_ctx->file);
    return sVar3;
  }
  __src = (input_ctx->detect).buf + sVar2;
  if (n < __n || n - __n == 0) {
    memcpy(buf,__src,n);
    psVar1 = &(input_ctx->detect).position;
    *psVar1 = *psVar1 + n;
  }
  else {
    memcpy(buf,__src,__n);
    psVar1 = &(input_ctx->detect).position;
    *psVar1 = *psVar1 + __n;
    sVar3 = fread(buf + __n,1,n - __n,(FILE *)input_ctx->file);
    n = sVar3 + __n;
  }
  return n;
}

Assistant:

size_t read_from_input(struct AvxInputContext *input_ctx, size_t n,
                       unsigned char *buf) {
  const size_t buffered_bytes =
      input_ctx->detect.buf_read - input_ctx->detect.position;
  size_t read_n;
  if (buffered_bytes == 0) {
    read_n = fread(buf, 1, n, input_ctx->file);
  } else if (n <= buffered_bytes) {
    memcpy(buf, input_ctx->detect.buf + input_ctx->detect.position, n);
    input_ctx->detect.position += n;
    read_n = n;
  } else {
    memcpy(buf, input_ctx->detect.buf + input_ctx->detect.position,
           buffered_bytes);
    input_ctx->detect.position += buffered_bytes;
    read_n = buffered_bytes;
    read_n +=
        fread(buf + buffered_bytes, 1, n - buffered_bytes, input_ctx->file);
  }
  return read_n;
}